

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbitmap.h
# Opt level: O0

void __thiscall
VBitmap::Impl::Impl(Impl *this,uint8_t *data,size_t w,size_t h,size_t bytesPerLine,Format format)

{
  size_t in_RCX;
  uint8_t *in_RDX;
  Impl *in_RSI;
  nullptr_t in_RDI;
  size_t in_R8;
  undefined1 in_R9B;
  undefined7 in_stack_ffffffffffffffd0;
  
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT17(in_R9B,in_stack_ffffffffffffffd0),in_RDI);
  *(undefined8 *)((long)in_RDI + 8) = 0;
  *(undefined4 *)((long)in_RDI + 0x10) = 0;
  *(undefined4 *)((long)in_RDI + 0x14) = 0;
  *(undefined4 *)((long)in_RDI + 0x18) = 0;
  *(undefined1 *)((long)in_RDI + 0x1c) = 0;
  *(undefined1 *)((long)in_RDI + 0x1d) = 0;
  reset(in_RSI,in_RDX,in_RCX,in_R8,CONCAT17(in_R9B,in_stack_ffffffffffffffd0),
        (Format)((ulong)in_RDI >> 0x38));
  return;
}

Assistant:

explicit Impl(uint8_t *data, size_t w, size_t h, size_t bytesPerLine,
                      VBitmap::Format format)
        {
            reset(data, w, h, bytesPerLine, format);
        }